

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O1

int64_t hdr_add(hdr_histogram *h,hdr_histogram *from)

{
  int64_t iVar1;
  _Bool _Var2;
  long lVar3;
  long lVar4;
  hdr_iter iter;
  hdr_iter local_a0;
  
  local_a0.counts_index = -1;
  local_a0.total_count = from->total_count;
  local_a0.count = 0;
  local_a0.cumulative_count = 0;
  local_a0.value = 0;
  local_a0.highest_equivalent_value = 0;
  local_a0.value_iterated_from = 0;
  local_a0.value_iterated_to = 0;
  local_a0.specifics.linear.value_units_per_bucket = 0;
  local_a0._next_fp = recorded_iter_next;
  local_a0.h = from;
  _Var2 = recorded_iter_next(&local_a0);
  lVar4 = 0;
  if (_Var2) {
    do {
      iVar1 = local_a0.count;
      _Var2 = hdr_record_values(h,local_a0.value,local_a0.count);
      lVar3 = 0;
      if (!_Var2) {
        lVar3 = iVar1;
      }
      lVar4 = lVar4 + lVar3;
      _Var2 = (*local_a0._next_fp)(&local_a0);
    } while (_Var2);
  }
  return lVar4;
}

Assistant:

int64_t hdr_add(struct hdr_histogram* h, const struct hdr_histogram* from)
{
    struct hdr_iter iter;
    int64_t dropped = 0;
    hdr_iter_recorded_init(&iter, from);

    while (hdr_iter_next(&iter))
    {
        int64_t value = iter.value;
        int64_t count = iter.count;

        if (!hdr_record_values(h, value, count))
        {
            dropped += count;
        }
    }

    return dropped;
}